

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_set_zero(ggml_tensor *tensor)

{
  void *__s;
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (tensor->ne[0] != 0) {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (uVar3 == 3) break;
      uVar1 = uVar3 + 1;
    } while (tensor->ne[uVar3 + 1] != 0);
    if (2 < uVar3) {
      if (tensor->buffer == (ggml_backend_buffer *)0x0) {
        __s = tensor->data;
        if (__s == (void *)0x0) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
                     ,0x17b5,"GGML_ASSERT(%s) failed","tensor->data");
        }
        sVar2 = ggml_nbytes(tensor);
        memset(__s,0,sVar2);
      }
      else {
        sVar2 = ggml_nbytes(tensor);
        ggml_backend_tensor_memset(tensor,'\0',0,sVar2);
      }
    }
  }
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_set_zero(struct ggml_tensor * tensor) {
    if (ggml_is_empty(tensor)) {
        return tensor;
    }
    if (tensor->buffer) {
        ggml_backend_tensor_memset(tensor, 0, 0, ggml_nbytes(tensor));
    } else {
        GGML_ASSERT(tensor->data);
        memset(tensor->data, 0, ggml_nbytes(tensor));
    }
    return tensor;
}